

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# errhandl.c
# Opt level: O2

void LASError(LASErrIdType ErrId,char *ProcName,char *Object1Name,char *Object2Name,
             char *Object3Name)

{
  char *__ptr;
  size_t sVar1;
  
  LASErrId = ErrId;
  free(LASProcName);
  free(LASObject1Name);
  __ptr = LASObject2Name;
  free(LASObject2Name);
  if (LASObject3Name != (char *)0x0) {
    free(__ptr);
  }
  LASObject1Name = (char *)0x0;
  LASObject2Name = (char *)0x0;
  LASObject3Name = (char *)0x0;
  sVar1 = strlen(ProcName);
  LASProcName = (char *)malloc(sVar1 + 1);
  if (LASProcName == (char *)0x0) {
    DAT_00000000 = '(';
    DAT_00000000_1._0_1_ = 'p';
    DAT_00000000_1._1_1_ = 'r';
    DAT_00000000_1._2_1_ = 'o';
    DAT_00000000_1._3_1_ = 'c';
    DAT_00000000_1._4_1_ = 'e';
    DAT_00000000_1._5_1_ = 'd';
    DAT_00000000_1._6_1_ = 'u';
    uRam0000000000000008._0_1_ = 'r';
    uRam0000000000000008._1_1_ = 'e';
    uRam0000000000000008._2_1_ = ' ';
    uRam0000000000000008._3_1_ = 'u';
    uRam0000000000000008._4_1_ = 'n';
    uRam0000000000000008._5_1_ = 'k';
    uRam0000000000000008._6_1_ = 'n';
    uRam0000000000000008._7_1_ = 'o';
    _DAT_00000010 = 0x296e77;
  }
  else {
    strcpy(LASProcName,ProcName);
    if (Object1Name != (char *)0x0) {
      sVar1 = strlen(Object1Name);
      if (sVar1 != 0) {
        LASObject1Name = (char *)malloc(sVar1 + 1);
        if (LASObject1Name != (char *)0x0) {
          strcpy(LASObject1Name,Object1Name);
        }
      }
    }
    if (Object2Name != (char *)0x0) {
      sVar1 = strlen(Object2Name);
      if (sVar1 != 0) {
        LASObject2Name = (char *)malloc(sVar1 + 1);
        if (LASObject2Name != (char *)0x0) {
          strcpy(LASObject2Name,Object2Name);
        }
      }
    }
    if (Object3Name != (char *)0x0) {
      sVar1 = strlen(Object3Name);
      if (sVar1 != 0) {
        LASObject3Name = (char *)malloc(sVar1 + 1);
        if (LASObject3Name != (char *)0x0) {
          strcpy(LASObject3Name,Object3Name);
        }
      }
    }
  }
  WriteLASErrDescr(_stderr);
  return;
}

Assistant:

void LASError(LASErrIdType ErrId, char *ProcName, char *Object1Name,
	      char *Object2Name, char *Object3Name)
/* Set error status to ErrId, ... */
{
    LASErrId = ErrId;
    
    /* release current values of error variables */
    if (LASProcName != NULL)
        free(LASProcName);
    if (LASObject1Name != NULL)
        free(LASObject1Name);
    if (LASObject2Name != NULL)
        free(LASObject2Name);
    if (LASObject3Name != NULL)
        free(LASObject2Name);
    LASProcName = NULL;
    LASObject1Name = NULL;
    LASObject2Name = NULL;
    LASObject3Name = NULL;
    
    LASProcName = (char *)malloc((strlen(ProcName) + 1) * sizeof(char));
    if (LASProcName != NULL) {
        strcpy(LASProcName, ProcName);
	
	if (Object1Name != NULL && strlen(Object1Name) > 0) {
            LASObject1Name = (char *)malloc((strlen(Object1Name) + 1) * sizeof(char));
            if (LASObject1Name != NULL)
                strcpy(LASObject1Name, Object1Name);
	}
	if (Object2Name != NULL && strlen(Object2Name) > 0) {
            LASObject2Name = (char *)malloc((strlen(Object2Name) + 1) * sizeof(char));
            if (LASObject2Name != NULL)
                strcpy(LASObject2Name, Object2Name);
	}
	if (Object3Name != NULL && strlen(Object3Name) > 0) {
            LASObject3Name = (char *)malloc((strlen(Object3Name) + 1) * sizeof(char));
            if (LASObject3Name != NULL)
                strcpy(LASObject3Name, Object3Name);
	}
    } else {
        strcpy(LASProcName, "(procedure unknown)");
    }

    WriteLASErrDescr(stderr);

}